

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterial_hair(SemanticParser *this,SP *in)

{
  bool bVar1;
  element_type *peVar2;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  float fVar3;
  SP SVar4;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP mat;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  float in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  string local_c0 [32];
  string local_a0 [28];
  float in_stack_ffffffffffffff7c;
  string *in_stack_ffffffffffffff80;
  ParamSet *in_stack_ffffffffffffff88;
  string local_70 [48];
  _Self local_40;
  _Self local_38;
  element_type *local_30;
  
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a4b0e);
  std::make_shared<pbrt::HairMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  local_30 = std::
             __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a4b2c);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffed8);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffed8);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::shared_ptr<pbrt::Material>::shared_ptr<pbrt::HairMaterial,void>
                ((shared_ptr<pbrt::Material> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (shared_ptr<pbrt::HairMaterial> *)in_stack_fffffffffffffed8);
      std::shared_ptr<pbrt::HairMaterial>::~shared_ptr((shared_ptr<pbrt::HairMaterial> *)0x1a4ea7);
      SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (SP)SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x1a4b89);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
            *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
           in_stack_fffffffffffffed8);
    std::__cxx11::string::string(local_a0,local_70);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                            (char *)in_stack_fffffffffffffed8);
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a4be3);
      fVar3 = syntactic::ParamSet::getParam1f
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c);
      peVar2 = std::
               __shared_ptr_access<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a4c0b);
      peVar2->eumelanin = fVar3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                              (char *)in_stack_fffffffffffffed8);
      if (bVar1) {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a4c94);
        fVar3 = syntactic::ParamSet::getParam1f
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff7c);
        peVar2 = std::
                 __shared_ptr_access<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a4cbc);
        peVar2->alpha = fVar3;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                                (char *)in_stack_fffffffffffffed8);
        in_stack_fffffffffffffeec = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
        if (bVar1) {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a4cfa);
          in_stack_fffffffffffffee8 =
               syntactic::ParamSet::getParam1f
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff7c);
          peVar2 = std::
                   __shared_ptr_access<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1a4d22);
          peVar2->beta_m = in_stack_fffffffffffffee8;
        }
        else {
          in_stack_fffffffffffffee7 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                               (char *)in_stack_fffffffffffffed8);
          if (!(bool)in_stack_fffffffffffffee7) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                           (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
            std::runtime_error::runtime_error(this_00,local_c0);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
             *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_hair(pbrt::syntactic::Material::SP in)
  {
    HairMaterial::SP mat = std::make_shared<HairMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "eumelanin") {
        mat->eumelanin = in->getParam1f(name);
      } else if (name == "alpha") {
        mat->alpha = in->getParam1f(name);
      } else if (name == "beta_m") {
        mat->beta_m = in->getParam1f(name);
      } else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("as-yet-unhandled hair-material parameter '"+it.first+"'");
    };
    return mat;
  }